

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

uint __thiscall
xercesc_4_0::ElemStack::mapPrefixToURI(ElemStack *this,XMLCh *prefixToMap,bool *unknown)

{
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar1;
  PrefMapElem *pPVar2;
  StackElem *pSVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  PoolElem *in_RAX;
  ulong uVar7;
  uint uVar8;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar9;
  XMLCh *pXVar10;
  XMLSize_t XVar11;
  XMLCh XVar12;
  ulong uVar13;
  ulong uVar14;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar15;
  bool bVar16;
  
  *unknown = false;
  if ((prefixToMap == (XMLCh *)0x0) || (uVar7 = (ulong)(ushort)*prefixToMap, uVar7 == 0)) {
    uVar8 = this->fGlobalPoolId;
  }
  else {
    pRVar1 = (this->fPrefixPool).fHashTable;
    XVar12 = prefixToMap[1];
    if (XVar12 != L'\0') {
      pXVar10 = prefixToMap + 2;
      do {
        uVar7 = (ulong)(ushort)XVar12 + (uVar7 >> 0x18) + uVar7 * 0x26;
        XVar12 = *pXVar10;
        pXVar10 = pXVar10 + 1;
      } while (XVar12 != L'\0');
    }
    pRVar9 = pRVar1->fBucketList[uVar7 % pRVar1->fHashModulus];
    pRVar15 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
    if (pRVar9 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
      do {
        bVar5 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,prefixToMap,pRVar9->fKey);
        pRVar15 = pRVar9;
        if (bVar5) break;
        pRVar9 = pRVar9->fNext;
        pRVar15 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
      } while (pRVar9 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
    }
    uVar8 = 0;
    if (pRVar15 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
      in_RAX = (PoolElem *)0x0;
    }
    else {
      in_RAX = pRVar15->fData;
    }
    if (in_RAX != (PoolElem *)0x0) {
      uVar8 = in_RAX->fId;
    }
  }
  uVar6 = (uint)in_RAX;
  if (uVar8 != 0) {
    if (uVar8 == this->fXMLPoolId) {
      return this->fXMLNamespaceId;
    }
    if (uVar8 == this->fXMLNSPoolId) {
      return this->fXMLNSNamespaceId;
    }
    XVar11 = this->fStackTop;
    bVar5 = XVar11 == 0;
    if (!bVar5) {
      do {
        uVar7 = this->fStack[XVar11 - 1]->fMapCount;
        bVar16 = uVar7 != 0;
        if (bVar16) {
          pPVar2 = this->fStack[XVar11 - 1]->fMap;
          if (pPVar2->fPrefId == uVar8) {
            uVar13 = 0;
          }
          else {
            uVar14 = 0;
            do {
              if (uVar7 - 1 == uVar14) {
                bVar16 = false;
                goto LAB_002a49e6;
              }
              uVar13 = uVar14 + 1;
              lVar4 = uVar14 + 1;
              uVar14 = uVar13;
            } while (pPVar2[lVar4].fPrefId != uVar8);
            bVar16 = uVar13 < uVar7;
          }
          in_RAX = (PoolElem *)(ulong)pPVar2[uVar13].fURIId;
        }
LAB_002a49e6:
        uVar6 = (uint)in_RAX;
        if (bVar16) break;
        XVar11 = XVar11 - 1;
        bVar5 = XVar11 == 0;
      } while (!bVar5);
    }
    if (!bVar5) {
      return uVar6;
    }
    pSVar3 = this->fGlobalNamespaces;
    if (pSVar3 != (StackElem *)0x0) {
      uVar7 = pSVar3->fMapCount;
      bVar5 = uVar7 != 0;
      if (bVar5) {
        pPVar2 = pSVar3->fMap;
        if (pPVar2->fPrefId == uVar8) {
          uVar13 = 0;
        }
        else {
          uVar14 = 0;
          do {
            if (uVar7 - 1 == uVar14) {
              bVar5 = false;
              goto LAB_002a4a47;
            }
            uVar13 = uVar14 + 1;
            lVar4 = uVar14 + 1;
            uVar14 = uVar13;
          } while (pPVar2[lVar4].fPrefId != uVar8);
          bVar5 = uVar13 < uVar7;
        }
        uVar6 = pPVar2[uVar13].fURIId;
      }
LAB_002a4a47:
      if (bVar5) {
        return uVar6;
      }
    }
    if (*prefixToMap == L'\0') {
      return this->fEmptyNamespaceId;
    }
  }
  *unknown = true;
  return this->fUnknownNamespaceId;
}

Assistant:

unsigned int ElemStack::mapPrefixToURI( const   XMLCh* const    prefixToMap
                                        ,       bool&           unknown) const
{
    // Assume we find it
    unknown = false;

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = (!prefixToMap || !*prefixToMap)?fGlobalPoolId : fPrefixPool.getId(prefixToMap);
    if (prefixId == 0)
    {
        unknown = true;
        return fUnknownNamespaceId;
    }
    //
    //  Check for the special prefixes 'xml' and 'xmlns' since they cannot
    //  be overridden.
    //
    else if (prefixId == fXMLPoolId)
        return fXMLNamespaceId;
    else if (prefixId == fXMLNSPoolId)
        return fXMLNSNamespaceId;

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    for (XMLSize_t index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // Search the map at this level for the passed prefix
        for (XMLSize_t mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
        {
            if (curRow->fMap[mapIndex].fPrefId == prefixId)
                return curRow->fMap[mapIndex].fURIId;
        }
    }
    //  If the prefix wasn't found, try in the global namespaces
    if(fGlobalNamespaces)
    {
        for (XMLSize_t mapIndex = 0; mapIndex < fGlobalNamespaces->fMapCount; mapIndex++)
        {
            if (fGlobalNamespaces->fMap[mapIndex].fPrefId == prefixId)
                return fGlobalNamespaces->fMap[mapIndex].fURIId;
        }
    }

    //
    //  If the prefix is an empty string, then we will return the special
    //  global namespace id. This can be overridden, but no one has or we
    //  would have not gotten here.
    //
    if (!*prefixToMap)
        return fEmptyNamespaceId;

    // Oh well, don't have a clue so return the unknown id
    unknown = true;
    return fUnknownNamespaceId;
}